

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.hpp
# Opt level: O2

void __thiscall VariableNode::~VariableNode(VariableNode *this)

{
  (this->super_ExpressionNode).super_Node._vptr_Node = (_func_int **)&PTR__VariableNode_001497e8;
  std::__cxx11::string::~string((string *)&this->name_);
  return;
}

Assistant:

VariableNode(const std::string& name): name_(name) {}